

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterBuffer.c
# Opt level: O1

ZyanStatus
ZydisFormatterBufferGetToken(ZydisFormatterBuffer *buffer,ZydisFormatterTokenConst **token)

{
  void *pvVar1;
  ZyanStatus ZVar2;
  
  ZVar2 = 0x80100004;
  if (token != (ZydisFormatterTokenConst **)0x0 && buffer != (ZydisFormatterBuffer *)0x0) {
    pvVar1 = (buffer->string).vector.data;
    *token = (ZydisFormatterTokenConst *)((long)pvVar1 + -2);
    ZVar2 = 0x100000;
    if (*(char *)((long)pvVar1 + -2) == '\0') {
      ZVar2 = 0x80100005;
    }
  }
  return ZVar2;
}

Assistant:

ZyanStatus ZydisFormatterBufferGetToken(const ZydisFormatterBuffer* buffer,
    ZydisFormatterTokenConst** token)
{
    if (!buffer || !token)
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    *token = ((ZydisFormatterTokenConst*)buffer->string.vector.data - 1);
    if ((*token)->type == ZYDIS_TOKEN_INVALID)
    {
        return ZYAN_STATUS_INVALID_OPERATION;
    }

    return ZYAN_STATUS_SUCCESS;
}